

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

void __thiscall ft::list<int,_ft::allocator<int>_>::pop_front(list<int,_ft::allocator<int>_> *this)

{
  pointer p;
  listNode<int> *plVar1;
  node *pnVar2;
  node *pnVar3;
  node *delNode;
  list<int,_ft::allocator<int>_> *this_local;
  
  pnVar2 = head(this);
  p = pnVar2->next;
  plVar1 = p->next;
  pnVar2 = head(this);
  pnVar2->next = plVar1;
  pnVar2 = head(this);
  pnVar3 = head(this);
  pnVar3->next->prev = pnVar2;
  allocator<ft::listNode<int>_>::destroy((allocator<ft::listNode<int>_> *)&this->field_0x18,p);
  allocator<ft::listNode<int>_>::deallocate((allocator<ft::listNode<int>_> *)&this->field_0x18,p,1);
  this->m_size = this->m_size - 1;
  return;
}

Assistant:

void pop_front() {
		node*	delNode = this->head()->next;
		this->head()->next = delNode->next;
		this->head()->next->prev = this->head();
		this->m_alloc.destroy(delNode);
		this->m_alloc.deallocate(delNode, 1);
		--this->m_size;
	}